

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_monte_carlo.cpp
# Opt level: O3

double r8vec_sum(int n,double *a)

{
  ulong uVar1;
  double dVar2;
  
  if (n < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + a[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return dVar2;
}

Assistant:

double r8vec_sum ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_SUM returns the sum of an R8VEC.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A[N], the vector.
//
//    Output, double R8VEC_SUM, the sum of the vector.
//
{
  int i;
  double value;

  value = 0.0;
  for ( i = 0; i < n; i++ )
  {
    value = value + a[i];
  }
  return value;
}